

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void * If_ManSatBuildFromCell
                 (char *pStr,Vec_Int_t **pvPiVars,Vec_Int_t **pvPoVars,Ifn_Ntk_t **ppNtk)

{
  Ifn_Ntk_t *p;
  sat_solver *psVar1;
  
  p = Ifn_NtkParse(pStr);
  Ifn_Prepare(p,(word *)0x0,p->nInps);
  *ppNtk = p;
  psVar1 = Ifn_ManSatBuild(p,pvPiVars,pvPoVars);
  return psVar1;
}

Assistant:

void * If_ManSatBuildFromCell( char * pStr, Vec_Int_t ** pvPiVars, Vec_Int_t ** pvPoVars, Ifn_Ntk_t ** ppNtk )
{
    Ifn_Ntk_t * p = Ifn_NtkParse( pStr );
    Ifn_Prepare( p, NULL, p->nInps );
    *ppNtk = p;
    if ( p == NULL )
        return NULL;
//    Ifn_NtkPrint( p );
    return Ifn_ManSatBuild( p, pvPiVars, pvPoVars );
}